

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

void erased_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  if (tree->tip == (vmd_bst_rev_t *)0x0) {
    free(node);
    return;
  }
  if ((node->field_0x20 & 0x20) == 0) {
    node->next = tree->erased;
    tree->erased = node;
    return;
  }
  dlist_insert(&tree->free,node);
  return;
}

Assistant:

static void
erased_node(bst_t *tree, bst_node_t *node)
{
	if (tree->tip == NULL)
		free(node);
	else if (node->inserted)
		dlist_insert(&tree->free, node);
	else
		slist_push(&tree->erased, node);
}